

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern.c
# Opt level: O0

xmlChar * xmlPatScanName(xmlPatParserContextPtr ctxt)

{
  int iVar1;
  bool bVar2;
  uint local_40;
  int local_38;
  uint local_34;
  int len;
  int val;
  xmlChar *ret;
  xmlChar *cur;
  xmlChar *q;
  xmlPatParserContextPtr ctxt_local;
  
  _len = (xmlChar *)0x0;
  while( true ) {
    bVar2 = true;
    if ((*ctxt->cur != ' ') && ((*ctxt->cur < 9 || (bVar2 = true, 10 < *ctxt->cur)))) {
      bVar2 = *ctxt->cur == '\r';
    }
    if (!bVar2) break;
    if (*ctxt->cur != '\0') {
      ctxt->cur = ctxt->cur + 1;
    }
  }
  ret = ctxt->cur;
  cur = ret;
  q = (xmlChar *)ctxt;
  local_34 = xmlStringCurrentChar((xmlParserCtxtPtr)0x0,ret,&local_38);
  if ((int)local_34 < 0x100) {
    if (((((0x40 < (int)local_34) && ((int)local_34 < 0x5b)) ||
         ((0x60 < (int)local_34 && ((int)local_34 < 0x7b)))) ||
        ((0xbf < (int)local_34 && ((int)local_34 < 0xd7)))) ||
       (((0xd7 < (int)local_34 && ((int)local_34 < 0xf7)) || (0xf7 < (int)local_34))))
    goto LAB_001a5d7c;
  }
  else {
    iVar1 = xmlCharInRange(local_34,&xmlIsBaseCharGroup);
    if (iVar1 != 0) goto LAB_001a5d7c;
  }
  if ((((int)local_34 < 0x100) ||
      (((((int)local_34 < 0x4e00 || (0x9fa5 < (int)local_34)) && (local_34 != 0x3007)) &&
       (((int)local_34 < 0x3021 || (0x3029 < (int)local_34)))))) &&
     ((local_34 != 0x5f && (local_34 != 0x3a)))) {
    return (xmlChar *)0x0;
  }
LAB_001a5d7c:
  do {
    if ((int)local_34 < 0x100) {
      if ((((((int)local_34 < 0x41) || (bVar2 = true, 0x5a < (int)local_34)) &&
           (((int)local_34 < 0x61 || (bVar2 = true, 0x7a < (int)local_34)))) &&
          ((((int)local_34 < 0xc0 || (bVar2 = true, 0xd6 < (int)local_34)) &&
           (((int)local_34 < 0xd8 || (bVar2 = true, 0xf6 < (int)local_34)))))) &&
         (bVar2 = true, (int)local_34 < 0xf8)) {
LAB_001a5e23:
        if (((int)local_34 < 0x100) ||
           (((((int)local_34 < 0x4e00 || (bVar2 = true, 0x9fa5 < (int)local_34)) &&
             (bVar2 = true, local_34 != 0x3007)) &&
            (((int)local_34 < 0x3021 || (bVar2 = true, 0x3029 < (int)local_34)))))) {
          if ((int)local_34 < 0x100) {
            if (((int)local_34 < 0x30) || (bVar2 = true, 0x39 < (int)local_34)) {
LAB_001a5ecb:
              bVar2 = true;
              if ((local_34 != 0x2e) &&
                 ((bVar2 = true, local_34 != 0x2d && (bVar2 = true, local_34 != 0x5f)))) {
                if (0xff < (int)local_34) {
                  iVar1 = xmlCharInRange(local_34,&xmlIsCombiningGroup);
                  bVar2 = true;
                  if (iVar1 != 0) goto LAB_001a5f5d;
                }
                if ((int)local_34 < 0x100) {
                  local_40 = (uint)(local_34 == 0xb7);
                }
                else {
                  local_40 = xmlCharInRange(local_34,&xmlIsExtenderGroup);
                }
                bVar2 = local_40 != 0;
              }
            }
          }
          else {
            iVar1 = xmlCharInRange(local_34,&xmlIsDigitGroup);
            bVar2 = true;
            if (iVar1 == 0) goto LAB_001a5ecb;
          }
        }
      }
    }
    else {
      iVar1 = xmlCharInRange(local_34,&xmlIsBaseCharGroup);
      bVar2 = true;
      if (iVar1 == 0) goto LAB_001a5e23;
    }
LAB_001a5f5d:
    if (!bVar2) {
      if (*(long *)(q + 0x18) == 0) {
        _len = xmlStrndup(cur,(int)ret - (int)cur);
      }
      else {
        _len = xmlDictLookup(*(xmlDictPtr *)(q + 0x18),cur,(int)ret - (int)cur);
      }
      *(xmlChar **)q = ret;
      return _len;
    }
    ret = ret + local_38;
    local_34 = xmlStringCurrentChar((xmlParserCtxtPtr)0x0,ret,&local_38);
  } while( true );
}

Assistant:

static xmlChar *
xmlPatScanName(xmlPatParserContextPtr ctxt) {
    const xmlChar *q, *cur;
    xmlChar *ret = NULL;
    int val, len;

    SKIP_BLANKS;

    cur = q = CUR_PTR;
    val = xmlStringCurrentChar(NULL, cur, &len);
    if (!IS_LETTER(val) && (val != '_') && (val != ':'))
	return(NULL);

    while ((IS_LETTER(val)) || (IS_DIGIT(val)) ||
           (val == '.') || (val == '-') ||
	   (val == '_') ||
	   (IS_COMBINING(val)) ||
	   (IS_EXTENDER(val))) {
	cur += len;
	val = xmlStringCurrentChar(NULL, cur, &len);
    }
    if (ctxt->dict)
	ret = (xmlChar *) xmlDictLookup(ctxt->dict, q, cur - q);
    else
	ret = xmlStrndup(q, cur - q);
    CUR_PTR = cur;
    return(ret);
}